

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_poly_vector.h
# Opt level: O0

int __thiscall
custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>::clone
          (CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_> *this
          ,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CustInterface *pCVar1;
  undefined1 local_40 [8];
  CloneVisitor v;
  void_pointer dest_local;
  pointer obj_local;
  allocator<custom::CustInterface> *a_local;
  CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_> *this_local;
  
  v.ptr = ___flags;
  CloneVisitor::CloneVisitor((CloneVisitor *)local_40,___flags);
  (*(code *)**__child_stack)(__child_stack,(CloneVisitor *)local_40);
  pCVar1 = CloneVisitor::release((CloneVisitor *)local_40);
  CloneVisitor::~CloneVisitor((CloneVisitor *)local_40);
  return (int)pCVar1;
}

Assistant:

pointer clone(const Allocator& a, pointer obj, void_pointer dest) const
    {
        CloneVisitor v(dest);
        obj->accept(v);
        return v.release();
    }